

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool __thiscall
(anonymous_namespace)::
QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (_anonymous_namespace_ *this,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          args,cmExecutionStatus *status,string *variable)

{
  string_view key_00;
  View view_00;
  cmExecutionStatus *pcVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  reference this_00;
  cmArgumentParser<Arguments> *pcVar5;
  cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
  *pcVar6;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *args_00;
  cmMakefile *pcVar7;
  ulong uVar8;
  View *pVVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string_view sVar11;
  static_string_view sVar12;
  undefined1 auVar13 [16];
  string_view sVar14;
  View local_6cc;
  byte local_691;
  undefined1 local_570 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_2;
  string local_518;
  string_view local_4f8;
  string_view local_4e8;
  undefined1 local_4d8 [8];
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result_1;
  string local_488;
  string_view local_468;
  string_view local_458;
  undefined1 local_448 [8];
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  cmWindowsRegistry registry;
  _Optional_payload_base<cmWindowsRegistry::View> local_3f4;
  View local_3ec;
  undefined1 auStack_3e8 [4];
  View view;
  char *pcStack_3e0;
  string_view local_3d8;
  cmMakefile *local_3c0;
  cmMakefile *makefile;
  cmAlphaNum local_3b0;
  cmAlphaNum local_380;
  string local_350;
  undefined1 local_330 [16];
  _Optional_payload_base<cmWindowsRegistry::View> local_31c;
  allocator<char> local_311;
  string local_310;
  undefined4 local_2ec;
  string_view local_2e8;
  string_view local_2d8;
  string_view local_2c8;
  string local_2b8;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  string local_238;
  undefined1 local_218 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  undefined1 local_e8 [8];
  cmArgumentParser<Arguments> parser;
  string *key;
  allocator<char> local_51;
  string local_50;
  cmExecutionStatus *local_30;
  string *variable_local;
  cmExecutionStatus *status_local;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  args_local;
  
  variable_local = (string *)args.End._M_current;
  args_local.Begin = args.Begin._M_current;
  local_30 = status;
  status_local = (cmExecutionStatus *)this;
  bVar3 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&status_local);
  psVar2 = variable_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"missing <key> specification.",&local_51);
    cmExecutionStatus::SetError((cmExecutionStatus *)psVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    args_local.End._M_current._7_1_ = 0;
  }
  else {
    parser.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&status_local);
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&parser.super_Base.Bindings.Positions.
                                     super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                     .
                                     super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                     ._M_impl + 0x10));
    cmArgumentParser<Arguments>::cmArgumentParser((cmArgumentParser<Arguments> *)local_e8);
    sVar12 = ::cm::operator____s("VALUE",5);
    pcVar5 = cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
             ::Bind<std::__cxx11::string>
                       ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                         *)local_e8,sVar12,0x30);
    sVar12 = ::cm::operator____s("VALUE_NAMES",0xb);
    pcVar5 = cmArgumentParser<Arguments>::Bind<bool>(pcVar5,sVar12,0x50);
    sVar12 = ::cm::operator____s("SUBKEYS",7);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar5,sVar12,0x51);
    sVar12 = ::cm::operator____s("VIEW",4);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar6,sVar12,0x58);
    sVar12 = ::cm::operator____s("SEPARATOR",9);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar6,sVar12,0x78);
    sVar12 = ::cm::operator____s("ERROR_VARIABLE",0xe);
    cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
    ::Bind<std::__cxx11::string>(pcVar6,sVar12,0x98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&arguments.ErrorVariable.field_2 + 8));
    args_00 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&status_local,1);
    cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_218,
               (cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                *)local_e8,args_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&arguments.ErrorVariable.field_2 + 8),0);
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&arguments.ErrorVariable.field_2 + 8));
    psVar2 = variable_local;
    if (bVar3) {
      pcVar7 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)variable_local);
      bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_218,pcVar7);
      if (bVar3) {
        args_local.End._M_current._7_1_ = 1;
        local_2ec = 1;
      }
      else {
        uVar8 = std::__cxx11::string::empty();
        if ((((uVar8 & 1) == 0) &&
            (((arguments.ValueName.field_2._M_local_buf[8] & 1U) != 0 ||
             ((arguments.ValueName.field_2._M_local_buf[9] & 1U) != 0)))) ||
           ((uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0 &&
            (((arguments.ValueName.field_2._M_local_buf[8] & 1U) != 0 &&
             ((arguments.ValueName.field_2._M_local_buf[9] & 1U) != 0)))))) {
          psVar2 = variable_local;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_310,
                     "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\"."
                     ,&local_311);
          cmExecutionStatus::SetError((cmExecutionStatus *)psVar2,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::allocator<char>::~allocator(&local_311);
          args_local.End._M_current._7_1_ = 0;
          local_2ec = 1;
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          local_691 = 0;
          if ((uVar4 & 1) == 0) {
            local_330 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&arguments.ValueNames);
            sVar14._M_str = local_330._8_8_;
            sVar14._M_len = (size_t)sVar14._M_str;
            local_31c = (_Optional_payload_base<cmWindowsRegistry::View>)
                        cmWindowsRegistry::ToView(local_330._0_8_,sVar14);
            bVar3 = std::optional::operator_cast_to_bool((optional *)&local_31c);
            local_691 = bVar3 ^ 0xff;
          }
          psVar2 = variable_local;
          if ((local_691 & 1) == 0) {
            pcVar7 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)variable_local);
            pcVar1 = local_30;
            local_3c0 = pcVar7;
            _auStack_3e8 = (string_view)::cm::operator____s("",0);
            local_3d8 = _auStack_3e8;
            cmMakefile::AddDefinition(pcVar7,(string *)pcVar1,_auStack_3e8);
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&arguments.ValueNames);
              sVar11._M_str = auVar13._8_8_;
              sVar11._M_len = (size_t)sVar11._M_str;
              local_3f4 = (_Optional_payload_base<cmWindowsRegistry::View>)
                          cmWindowsRegistry::ToView(auVar13._0_8_,sVar11);
              pVVar9 = std::optional<cmWindowsRegistry::View>::operator*
                                 ((optional<cmWindowsRegistry::View> *)&local_3f4);
              local_6cc = *pVVar9;
            }
            else {
              local_6cc = Both;
            }
            local_3ec = local_6cc;
            cmWindowsRegistry::cmWindowsRegistry
                      ((cmWindowsRegistry *)
                       &result.
                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_engaged,local_3c0,&cmWindowsRegistry::AllTypes);
            if ((arguments.ValueName.field_2._M_local_buf[8] & 1U) == 0) {
              if ((arguments.ValueName.field_2._M_local_buf[9] & 1U) == 0) {
                key_00 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
                ;
                sVar11 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)
                                    &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                     super__Rb_tree_header._M_node_count);
                view_00 = local_3ec;
                sVar14 = (string_view)
                         std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)(arguments.View.field_2._M_local_buf + 8));
                cmWindowsRegistry::ReadValue_abi_cxx11_
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_570,
                           (cmWindowsRegistry *)
                           &result.
                            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_engaged,key_00,sVar11,view_00,sVar14);
                bVar3 = std::optional::operator_cast_to_bool((optional *)local_570);
                pcVar1 = local_30;
                pcVar7 = local_3c0;
                if (bVar3) {
                  this_01 = std::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_570);
                  sVar14 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)this_01);
                  cmMakefile::AddDefinition(pcVar7,(string *)pcVar1,sVar14);
                }
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_570);
              }
              else {
                local_4e8 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)this_00);
                cmWindowsRegistry::GetSubKeys_abi_cxx11_
                          ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_4d8,
                           (cmWindowsRegistry *)
                           &result.
                            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_engaged,local_4e8,local_3ec);
                bVar3 = std::optional::operator_cast_to_bool((optional *)local_4d8);
                pcVar1 = local_30;
                pcVar7 = local_3c0;
                if (bVar3) {
                  pvVar10 = std::
                            optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_4d8);
                  sVar14 = (string_view)::cm::operator____s(";",1);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &result_2.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
                  cmJoin(&local_518,pvVar10,sVar14,stack0xfffffffffffffab8);
                  local_4f8 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)&local_518);
                  cmMakefile::AddDefinition(pcVar7,(string *)pcVar1,local_4f8);
                  std::__cxx11::string::~string((string *)&local_518);
                }
                std::
                optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_4d8);
              }
            }
            else {
              local_458 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)this_00);
              cmWindowsRegistry::GetValueNames_abi_cxx11_
                        ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_448,
                         (cmWindowsRegistry *)
                         &result.
                          super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_engaged,local_458,local_3ec);
              bVar3 = std::optional::operator_cast_to_bool((optional *)local_448);
              pcVar1 = local_30;
              pcVar7 = local_3c0;
              if (bVar3) {
                pvVar10 = std::
                          optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_448);
                sVar14 = (string_view)::cm::operator____s(";",1);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &result_1.
                            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_engaged);
                cmJoin(&local_488,pvVar10,sVar14,stack0xfffffffffffffb48);
                local_468 = (string_view)
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&local_488);
                cmMakefile::AddDefinition(pcVar7,(string *)pcVar1,local_468);
                std::__cxx11::string::~string((string *)&local_488);
              }
              std::
              optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_448);
            }
            uVar8 = std::__cxx11::string::empty();
            pcVar7 = local_3c0;
            if ((uVar8 & 1) == 0) {
              sVar14 = cmWindowsRegistry::GetLastError
                                 ((cmWindowsRegistry *)
                                  &result.
                                   super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_engaged);
              cmMakefile::AddDefinition
                        (pcVar7,(string *)((long)&arguments.Separator.field_2 + 8),sVar14);
            }
            args_local.End._M_current._7_1_ = 1;
            local_2ec = 1;
            cmWindowsRegistry::~cmWindowsRegistry
                      ((cmWindowsRegistry *)
                       &result.
                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_engaged);
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_380,"given invalid value for \"VIEW\": ");
            cmAlphaNum::cmAlphaNum(&local_3b0,(string *)&arguments.ValueNames);
            makefile._7_1_ = 0x2e;
            cmStrCat<char>(&local_350,&local_380,&local_3b0,(char *)((long)&makefile + 7));
            cmExecutionStatus::SetError((cmExecutionStatus *)psVar2,&local_350);
            std::__cxx11::string::~string((string *)&local_350);
            args_local.End._M_current._7_1_ = 0;
            local_2ec = 1;
          }
        }
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_268,"given invalid argument(s) \"");
      local_2d8 = (string_view)::cm::operator____s(", ",2);
      local_2c8 = local_2d8;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8);
      cmJoin(&local_2b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&arguments.ErrorVariable.field_2 + 8),local_2c8,local_2e8);
      cmAlphaNum::cmAlphaNum(&local_298,&local_2b8);
      cmStrCat<char[3]>(&local_238,&local_268,&local_298,(char (*) [3])0xbfb275);
      cmExecutionStatus::SetError((cmExecutionStatus *)psVar2,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2b8);
      args_local.End._M_current._7_1_ = 0;
      local_2ec = 1;
    }
    anon_unknown.dwarf_1c97c1::
    QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::Arguments::~Arguments((Arguments *)local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&arguments.ErrorVariable.field_2 + 8));
    cmArgumentParser<Arguments>::~cmArgumentParser((cmArgumentParser<Arguments> *)local_e8);
  }
  return (bool)(args_local.End._M_current._7_1_ & 1);
}

Assistant:

bool QueryWindowsRegistry(Range args, cmExecutionStatus& status,
                          std::string const& variable)
{
  using View = cmWindowsRegistry::View;
  if (args.empty()) {
    status.SetError("missing <key> specification.");
    return false;
  }
  std::string const& key = *args.begin();

  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string ValueName;
    bool ValueNames = false;
    bool SubKeys = false;
    std::string View;
    std::string Separator;
    std::string ErrorVariable;
  };
  cmArgumentParser<Arguments> parser;
  parser.Bind("VALUE"_s, &Arguments::ValueName)
    .Bind("VALUE_NAMES"_s, &Arguments::ValueNames)
    .Bind("SUBKEYS"_s, &Arguments::SubKeys)
    .Bind("VIEW"_s, &Arguments::View)
    .Bind("SEPARATOR"_s, &Arguments::Separator)
    .Bind("ERROR_VARIABLE"_s, &Arguments::ErrorVariable);
  std::vector<std::string> invalidArgs;

  Arguments const arguments = parser.Parse(args.advance(1), &invalidArgs);
  if (!invalidArgs.empty()) {
    status.SetError(cmStrCat("given invalid argument(s) \"",
                             cmJoin(invalidArgs, ", "_s), "\"."));
    return false;
  }
  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if ((!arguments.ValueName.empty() &&
       (arguments.ValueNames || arguments.SubKeys)) ||
      (arguments.ValueName.empty() && arguments.ValueNames &&
       arguments.SubKeys)) {
    status.SetError("given mutually exclusive sub-options \"VALUE\", "
                    "\"VALUE_NAMES\" or \"SUBKEYS\".");
    return false;
  }

  if (!arguments.View.empty() && !cmWindowsRegistry::ToView(arguments.View)) {
    status.SetError(
      cmStrCat("given invalid value for \"VIEW\": ", arguments.View, '.'));
    return false;
  }

  auto& makefile = status.GetMakefile();

  makefile.AddDefinition(variable, ""_s);

  auto view = arguments.View.empty()
    ? View::Both
    : *cmWindowsRegistry::ToView(arguments.View);
  cmWindowsRegistry registry(makefile);
  if (arguments.ValueNames) {
    auto result = registry.GetValueNames(key, view);
    if (result) {
      makefile.AddDefinition(variable, cmJoin(*result, ";"_s));
    }
  } else if (arguments.SubKeys) {
    auto result = registry.GetSubKeys(key, view);
    if (result) {
      makefile.AddDefinition(variable, cmJoin(*result, ";"_s));
    }
  } else {
    auto result =
      registry.ReadValue(key, arguments.ValueName, view, arguments.Separator);
    if (result) {
      makefile.AddDefinition(variable, *result);
    }
  }

  // return error message if requested
  if (!arguments.ErrorVariable.empty()) {
    makefile.AddDefinition(arguments.ErrorVariable, registry.GetLastError());
  }

  return true;
}